

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSizeAllocationsManager.hpp
# Opt level: O3

void __thiscall
Diligent::VariableSizeAllocationsManager::~VariableSizeAllocationsManager
          (VariableSizeAllocationsManager *this)

{
  size_t sVar1;
  _Base_ptr p_Var2;
  _Base_ptr Args_1;
  string msg;
  string local_30;
  
  sVar1 = (this->m_FreeBlocksByOffset)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (sVar1 != 1) {
    if ((sVar1 == 0) &&
       ((this->m_FreeBlocksBySize)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0))
    goto LAB_002505be;
    FormatString<char[30]>(&local_30,(char (*) [30])"Single free block is expected");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"~VariableSizeAllocationsManager",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
               ,0x88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  p_Var2 = (this->m_FreeBlocksByOffset)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (*(long *)(p_Var2 + 1) != 0) {
    FormatString<char[38]>(&local_30,(char (*) [38])"Head chunk offset is expected to be 0");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"~VariableSizeAllocationsManager",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
               ,0x89);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    p_Var2 = (this->m_FreeBlocksByOffset)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  Args_1 = p_Var2[1]._M_parent;
  if (Args_1 != (_Base_ptr)this->m_MaxSize) {
    FormatString<char[35],unsigned_long>
              (&local_30,(Diligent *)"Head chunk size is expected to be ",
               (char (*) [35])&this->m_MaxSize,(unsigned_long *)Args_1);
    Args_1 = (_Base_ptr)0x8a;
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"~VariableSizeAllocationsManager",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
               ,0x8a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    p_Var2 = (this->m_FreeBlocksByOffset)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  if (p_Var2[1]._M_left !=
      (this->m_FreeBlocksBySize)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
    FormatString<char[26],char[81]>
              (&local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "m_FreeBlocksByOffset.begin()->second.OrderBySizeIt == m_FreeBlocksBySize.begin()",
               (char (*) [81])Args_1);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"~VariableSizeAllocationsManager",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
               ,0x8b);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  sVar1 = (this->m_FreeBlocksBySize)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (sVar1 != (this->m_FreeBlocksByOffset)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    FormatString<char[36]>(&local_30,(char (*) [36])"Sizes of the two maps must be equal");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"~VariableSizeAllocationsManager",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
               ,0x8c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    sVar1 = (this->m_FreeBlocksBySize)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  }
  if (sVar1 != 1) {
    FormatString<char[30]>(&local_30,(char (*) [30])"Single free block is expected");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"~VariableSizeAllocationsManager",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
               ,0x8e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  p_Var2 = (this->m_FreeBlocksBySize)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (*(unsigned_long **)(p_Var2 + 1) != (unsigned_long *)this->m_MaxSize) {
    FormatString<char[35],unsigned_long>
              (&local_30,(Diligent *)"Head chunk size is expected to be ",
               (char (*) [35])&this->m_MaxSize,*(unsigned_long **)(p_Var2 + 1));
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"~VariableSizeAllocationsManager",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
               ,0x8f);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    p_Var2 = (this->m_FreeBlocksBySize)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  if (p_Var2[1]._M_parent !=
      (this->m_FreeBlocksByOffset)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
    FormatString<char[22]>(&local_30,(char (*) [22])"Incorrect first block");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"~VariableSizeAllocationsManager",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
               ,0x90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
LAB_002505be:
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>_>,_Diligent::IMemoryAllocator>_>
  ::~_Rb_tree(&(this->m_FreeBlocksBySize)._M_t);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_std::_Select1st<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
  ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_std::_Select1st<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
               *)this);
  return;
}

Assistant:

~VariableSizeAllocationsManager()
    {
#ifdef DILIGENT_DEBUG
        if (!m_FreeBlocksByOffset.empty() || !m_FreeBlocksBySize.empty())
        {
            VERIFY(m_FreeBlocksByOffset.size() == 1, "Single free block is expected");
            VERIFY(m_FreeBlocksByOffset.begin()->first == 0, "Head chunk offset is expected to be 0");
            VERIFY(m_FreeBlocksByOffset.begin()->second.Size == m_MaxSize, "Head chunk size is expected to be ", m_MaxSize);
            VERIFY_EXPR(m_FreeBlocksByOffset.begin()->second.OrderBySizeIt == m_FreeBlocksBySize.begin());
            VERIFY(m_FreeBlocksBySize.size() == m_FreeBlocksByOffset.size(), "Sizes of the two maps must be equal");

            VERIFY(m_FreeBlocksBySize.size() == 1, "Single free block is expected");
            VERIFY(m_FreeBlocksBySize.begin()->first == m_MaxSize, "Head chunk size is expected to be ", m_MaxSize);
            VERIFY(m_FreeBlocksBySize.begin()->second == m_FreeBlocksByOffset.begin(), "Incorrect first block");
        }
#endif
    }